

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O1

BOOL __thiscall
Js::DynamicObject::ToPrimitiveImpl<398>
          (DynamicObject *this,Var *result,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  DynamicObject *pDVar5;
  DynamicObject *pDVar6;
  JavascriptFunction *aValue;
  undefined4 *puVar7;
  PropertyId extraout_EDX;
  PropertyId extraout_EDX_00;
  PropertyId extraout_EDX_01;
  PropertyId extraout_EDX_02;
  PropertyId extraout_EDX_03;
  PropertyId propertyId;
  
  bVar2 = JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties
                    (&this->super_RecyclableObject);
  propertyId = extraout_EDX;
  if (bVar2) {
    pDVar5 = (DynamicObject *)RecyclableObject::GetPrototype(&this->super_RecyclableObject);
    pDVar6 = JavascriptLibraryBase::GetObjectPrototype
                       (&((requestContext->super_ScriptContextBase).javascriptLibrary)->
                         super_JavascriptLibraryBase);
    propertyId = extraout_EDX_00;
    if (pDVar5 == pDVar6) {
      iVar3 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x66])(this);
      propertyId = extraout_EDX_01;
      if (iVar3 == 0) {
        pDVar5 = JavascriptLibraryBase::GetObjectPrototype
                           (&((requestContext->super_ScriptContextBase).javascriptLibrary)->
                             super_JavascriptLibraryBase);
        iVar3 = (*(pDVar5->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x66])(pDVar5);
        propertyId = extraout_EDX_02;
        if (iVar3 == 0) {
          aValue = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                   objectValueOfFunction).ptr;
          goto LAB_00dc49a7;
        }
      }
    }
  }
  aValue = (JavascriptFunction *)0x0;
LAB_00dc49a7:
  if (aValue == (JavascriptFunction *)0x0) {
    aValue = (JavascriptFunction *)
             JavascriptOperators::PatchGetValueUsingSpecifiedInlineCache
                       (requestContext->valueOfInlineCache,this,&this->super_RecyclableObject,0x18e,
                        requestContext);
    propertyId = extraout_EDX_03;
  }
  if (aValue != (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                objectValueOfFunction).ptr) {
    BVar4 = CallToPrimitiveFunction(this,aValue,propertyId,result,requestContext);
    return BVar4;
  }
  bVar2 = JavascriptConversion::IsCallable(aValue);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                ,0x1af,"(JavascriptConversion::IsCallable(aValue))",
                                "JavascriptConversion::IsCallable(aValue)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  return 0;
}

Assistant:

BOOL DynamicObject::ToPrimitiveImpl(Var* result, ScriptContext * requestContext)
    {
        CompileAssert(propertyId == PropertyIds::valueOf || propertyId == PropertyIds::toString);
        Var aValue = nullptr;
        if (JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties(this))
        {
            if (this->GetPrototype() == requestContext->GetLibrary()->GetObjectPrototype() &&
                !this->IsCrossSiteObject() &&
                !requestContext->GetLibrary()->GetObjectPrototype()->IsCrossSiteObject())
            {
                aValue = (propertyId == PropertyIds::valueOf)
                    ? requestContext->GetLibrary()->GetObjectValueOfFunction()
                    : requestContext->GetLibrary()->GetObjectToStringFunction();
            }
        }
        if(!aValue)
        {
            InlineCache * inlineCache = propertyId == PropertyIds::valueOf ? requestContext->GetValueOfInlineCache() : requestContext->GetToStringInlineCache();
            // Use per script context inline cache for valueOf and toString
            aValue = JavascriptOperators::PatchGetValueUsingSpecifiedInlineCache(inlineCache, this, this, propertyId, requestContext);
        }

        // Fast path to the default valueOf/toString implementation
        if (propertyId == PropertyIds::valueOf)
        {
            if (aValue == requestContext->GetLibrary()->GetObjectValueOfFunction())
            {
                Assert(JavascriptConversion::IsCallable(aValue));
                // The default Object.prototype.valueOf will in turn just call ToObject().
                // The result is always an object if it is not undefined or null (which "this" is not)
                return false;
            }
        }
        else
        {
            if (aValue == requestContext->GetLibrary()->GetObjectToStringFunction())
            {
                Assert(JavascriptConversion::IsCallable(aValue));
                // These typeIds should never be here (they override ToPrimitive or they don't derive to DynamicObject::ToPrimitive)
                // Otherwise, they may case implicit call in ToStringHelper
                Assert(this->GetTypeId() != TypeIds_HostDispatch
                    && this->GetTypeId() != TypeIds_HostObject);
                *result = JavascriptObject::ToStringHelper(this, requestContext);
                return true;
            }
        }

        return CallToPrimitiveFunction(aValue, propertyId, result, requestContext);
    }